

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemFromBtree(BtCursor *pCur,int offset,int amt,int key,Mem *pMem)

{
  uint in_EAX;
  int iVar1;
  int iVar2;
  void *pvVar3;
  int available;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  if (key == 0) {
    pvVar3 = sqlite3BtreeDataFetch(pCur,(int *)((long)&uStack_38 + 4));
  }
  else {
    pvVar3 = sqlite3BtreeKeyFetch(pCur,(int *)((long)&uStack_38 + 4));
  }
  if ((uStack_38._4_4_ < amt + offset) || ((pMem->flags & 0x400) != 0)) {
    iVar1 = sqlite3VdbeMemGrow(pMem,amt + 2,0);
    if (iVar1 == 0) {
      pMem->flags = 0x610;
      pMem->type = '\x04';
      pMem->enc = '\0';
      if (key == 0) {
        iVar2 = sqlite3BtreeData(pCur,offset,amt,pMem->z);
      }
      else {
        iVar2 = sqlite3BtreeKey(pCur,offset,amt,pMem->z);
      }
      pMem->z[amt] = '\0';
      pMem->z[(long)amt + 1] = '\0';
      iVar1 = 0;
      if (iVar2 != 0) {
        sqlite3VdbeMemRelease(pMem);
        iVar1 = iVar2;
      }
    }
  }
  else {
    sqlite3VdbeMemRelease(pMem);
    pMem->z = (char *)((long)pvVar3 + (long)offset);
    pMem->flags = 0x1010;
    iVar1 = 0;
  }
  pMem->n = amt;
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemFromBtree(
  BtCursor *pCur,   /* Cursor pointing at record to retrieve. */
  int offset,       /* Offset from the start of data to return bytes from. */
  int amt,          /* Number of bytes to return. */
  int key,          /* If true, retrieve from the btree key, not data. */
  Mem *pMem         /* OUT: Return data in this Mem structure. */
){
  char *zData;        /* Data from the btree layer */
  int available = 0;  /* Number of bytes available on the local btree page */
  int rc = SQLITE_OK; /* Return code */

  assert( sqlite3BtreeCursorIsValid(pCur) );

  /* Note: the calls to BtreeKeyFetch() and DataFetch() below assert() 
  ** that both the BtShared and database handle mutexes are held. */
  assert( (pMem->flags & MEM_RowSet)==0 );
  if( key ){
    zData = (char *)sqlite3BtreeKeyFetch(pCur, &available);
  }else{
    zData = (char *)sqlite3BtreeDataFetch(pCur, &available);
  }
  assert( zData!=0 );

  if( offset+amt<=available && (pMem->flags&MEM_Dyn)==0 ){
    sqlite3VdbeMemRelease(pMem);
    pMem->z = &zData[offset];
    pMem->flags = MEM_Blob|MEM_Ephem;
  }else if( SQLITE_OK==(rc = sqlite3VdbeMemGrow(pMem, amt+2, 0)) ){
    pMem->flags = MEM_Blob|MEM_Dyn|MEM_Term;
    pMem->enc = 0;
    pMem->type = SQLITE_BLOB;
    if( key ){
      rc = sqlite3BtreeKey(pCur, offset, amt, pMem->z);
    }else{
      rc = sqlite3BtreeData(pCur, offset, amt, pMem->z);
    }
    pMem->z[amt] = 0;
    pMem->z[amt+1] = 0;
    if( rc!=SQLITE_OK ){
      sqlite3VdbeMemRelease(pMem);
    }
  }
  pMem->n = amt;

  return rc;
}